

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::DtlsSession::GetStateString_abi_cxx11_
          (string *__return_storage_ptr__,DtlsSession *this)

{
  allocator local_11;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_11);
  if (this->mState < 4) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DtlsSession::GetStateString() const
{
    std::string stateString = "UNKNOWN";
    switch (mState)
    {
    case State::kOpen:
        stateString = "OPEN";
        break;
    case State::kConnecting:
        stateString = "CONNECTING";
        break;
    case State::kConnected:
        stateString = "CONNECTED";
        break;
    case State::kDisconnected:
        stateString = "DISCONNECTED";
        break;
    }
    return stateString;
}